

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

string * slang::ast::formatWidth<slang::ast::StreamingConcatenationExpression>
                   (string *__return_storage_ptr__,StreamingConcatenationExpression *bitstream,
                   BitstreamSizeMode mode)

{
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *extraout_RDX;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *extraout_RDX_00;
  size_t sVar1;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *extraout_RDX_01;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *buf;
  char *pcVar2;
  DynamicSize *args;
  format_string<unsigned_long_&,_unsigned_long_&> fmt;
  format_string<> fmt_00;
  format_string<unsigned_long_&> fmt_01;
  DynamicSize size;
  FormatBuffer buffer;
  
  buffer.buf.super_buffer<char>.ptr_ = buffer.buf.store_;
  buffer.buf.super_buffer<char>.size_ = 0;
  buffer.buf.super_buffer<char>.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  buffer.buf.super_buffer<char>.capacity_ = 500;
  buffer.showColors = false;
  dynamicBitstreamSize(&size,bitstream,mode);
  if (size.isValid == false) {
    fmt_00.str.size_ = 10;
    fmt_00.str.data_ = "<overflow>";
    FormatBuffer::format<>(&buffer,fmt_00);
    buf = extraout_RDX_00;
  }
  else {
    args = (DynamicSize *)&size.fixed;
    if (size.multiplier == 0) {
      sVar1 = 2;
      pcVar2 = "{}";
    }
    else {
      if (size.fixed != 0) {
        fmt.str.size_ = 7;
        fmt.str.data_ = "{}*n+{}";
        FormatBuffer::format<unsigned_long&,unsigned_long&>
                  (&buffer,fmt,&size.multiplier,(unsigned_long *)args);
        buf = extraout_RDX;
        goto LAB_00257f00;
      }
      sVar1 = 4;
      pcVar2 = "{}*n";
      args = &size;
    }
    fmt_01.str.size_ = sVar1;
    fmt_01.str.data_ = pcVar2;
    FormatBuffer::format<unsigned_long&>(&buffer,fmt_01,&args->multiplier);
    buf = extraout_RDX_01;
  }
LAB_00257f00:
  ::fmt::v11::to_string<500ul>(__return_storage_ptr__,(v11 *)&buffer,buf);
  ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate
            (&buffer.buf);
  return __return_storage_ptr__;
}

Assistant:

static std::string formatWidth(const T& bitstream, BitstreamSizeMode mode) {
    FormatBuffer buffer;
    auto size = dynamicBitstreamSize(bitstream, mode);
    if (!size)
        buffer.format("<overflow>");
    else if (!size.multiplier)
        buffer.format("{}", size.fixed);
    else if (!size.fixed)
        buffer.format("{}*n", size.multiplier);
    else
        buffer.format("{}*n+{}", size.multiplier, size.fixed);
    return buffer.str();
}